

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void __thiscall
pstore::broker::command_processor::thread_entry(command_processor *this,fifo_path *fifo)

{
  long lVar1;
  undefined8 *puVar2;
  not_null<const_char_*> nVar3;
  pointer *__ptr;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar4;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_1;
  long *in_FS_OFFSET;
  undefined1 local_68 [8];
  unique_lock<std::mutex> local_60;
  undefined8 local_50;
  not_null<const_char_*> local_48 [2];
  not_null<const_char_*> local_38;
  
  local_38.ptr_ = "Waiting for commands";
  gsl::not_null<const_char_*>::ensure_invariant(&local_38);
  nVar3.ptr_ = local_38.ptr_;
  pstore::details::log_destinations::__tls_init();
  lVar1 = *in_FS_OFFSET;
  if (*(long *)(lVar1 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar4 = *(undefined8 **)(lVar1 + -8);
    puVar2 = (undefined8 *)puVar4[1];
    for (puVar4 = (undefined8 *)*puVar4; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      (**(code **)(*(long *)*puVar4 + 0x48))((long *)*puVar4,6,nVar3.ptr_);
    }
  }
  if (((this->commands_done_)._M_base._M_i & 1U) == 0) {
    local_50 = pool + 0x28;
    do {
      message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
      ::pop((message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
             *)local_68);
      if (local_68 == (undefined1  [8])0x0) {
        assert_failed("msg",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/command.cpp"
                      ,0xdb);
      }
      process_command(this,fifo,(message_type *)local_68);
      local_60._M_device = (mutex_type *)pool;
      local_60._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_60);
      local_60._M_owns = true;
      if (local_68 == (undefined1  [8])0x0) {
        assert_failed("ptr.get () != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/message_pool.hpp"
                      ,0x44);
      }
      if (pool._88_8_ == pool._104_8_ + -8) {
        std::
        deque<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>,std::allocator<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>>
        ::
        _M_push_back_aux<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>
                  ((deque<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>,std::allocator<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>>
                    *)local_50,
                   (unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
                    *)local_68);
      }
      else {
        *(undefined1 (*) [8])pool._88_8_ = local_68;
        local_68 = (undefined1  [8])0x0;
        pool._88_8_ = pool._88_8_ + 8;
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_60);
      if (local_68 != (undefined1  [8])0x0) {
        operator_delete((void *)local_68,0x100);
      }
    } while (((this->commands_done_)._M_base._M_i & 1U) == 0);
  }
  local_48[0].ptr_ = "Exiting command thread";
  gsl::not_null<const_char_*>::ensure_invariant(local_48);
  nVar3.ptr_ = local_48[0].ptr_;
  pstore::details::log_destinations::__tls_init();
  lVar1 = *in_FS_OFFSET;
  if (*(long *)(lVar1 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar4 = *(undefined8 **)(lVar1 + -8);
    puVar2 = (undefined8 *)puVar4[1];
    for (puVar4 = (undefined8 *)*puVar4; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      (**(code **)(*(long *)*puVar4 + 0x48))((long *)*puVar4,6,nVar3.ptr_);
    }
  }
  return;
}

Assistant:

void command_processor::thread_entry (brokerface::fifo_path const & fifo) {
            try {
                pstore::log (priority::info, "Waiting for commands");
                while (!commands_done_) {
                    brokerface::message_ptr msg = messages_.pop ();
                    PSTORE_ASSERT (msg);
                    this->process_command (fifo, *msg);
                    pool.return_to_pool (std::move (msg));
                }
            } catch (std::exception const & ex) {
                pstore::log (priority::error, "An error occurred: ", ex.what ());
            } catch (...) {
                pstore::log (priority::error, "Unknown error");
            }
            pstore::log (priority::info, "Exiting command thread");
        }